

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

void lws_filename_purify_inplace(char *filename)

{
  char *local_10;
  char *filename_local;
  
  for (local_10 = filename; *local_10 != '\0'; local_10 = local_10 + 1) {
    if ((*local_10 == '.') && (local_10[1] == '.')) {
      *local_10 = '_';
      local_10[1] = '_';
    }
    if ((((*local_10 == ':') || (*local_10 == '\\')) || (*local_10 == '$')) || (*local_10 == '%')) {
      *local_10 = '_';
    }
  }
  return;
}

Assistant:

void
lws_filename_purify_inplace(char *filename)
{
	while (*filename) {

		if (*filename == '.' && filename[1] == '.') {
			*filename = '_';
			filename[1] = '_';
		}

		if (*filename == ':' ||
#if !defined(WIN32)
		    *filename == '\\' ||
#endif
		    *filename == '$' ||
		    *filename == '%')
			*filename = '_';

		filename++;
	}
}